

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

bool __thiscall
Imath_3_2::Matrix44<float>::equalWithAbsError(Matrix44<float> *this,Matrix44<float> *m,float e)

{
  bool bVar1;
  long in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  int j;
  int i;
  int local_24;
  int local_20;
  
  local_20 = 0;
  do {
    if (3 < local_20) {
      return true;
    }
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      bVar1 = equalWithAbsError<float>
                        (*(float *)(in_RDI + (long)local_20 * 0x10 + (long)local_24 * 4),
                         *(float *)(in_RSI + (long)local_20 * 0x10 + (long)local_24 * 4),in_XMM0_Da)
      ;
      if (!bVar1) {
        return false;
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline bool
Matrix44<T>::equalWithAbsError (const Matrix44<T>& m, T e) const IMATH_NOEXCEPT
{
    for (int i = 0; i < 4; i++)
        for (int j = 0; j < 4; j++)
            if (!IMATH_INTERNAL_NAMESPACE::equalWithAbsError (
                    (*this).x[i][j], m.x[i][j], e))
                return false;

    return true;
}